

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O0

vm_register * init_register(void)

{
  vm_register *__s;
  undefined4 *puVar1;
  vm_register *ptr;
  int temp;
  
  __s = (vm_register *)malloc(0x44);
  if (__s != (vm_register *)0x0) {
    memset(__s,0,0x44);
    __s->R6 = 0xffffffff;
    __s->R7 = 0xffffffff;
    return __s;
  }
  puVar1 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar1 = 0xf3;
  __cxa_throw(puVar1,&int::typeinfo,0);
}

Assistant:

vm_register* init_register() {
	int temp{ sizeof(vm_register) };
	vm_register *ptr{ nullptr };
	ptr = (vm_register*)malloc(temp);
	if (ptr!=nullptr)
	{
		memset(ptr, 0, temp);//内存清空
		ptr->R6 = unsigned(-1);//调试寄存器值0xffffffff
		ptr->R7 = unsigned(-1);//调试寄存器值0xffffffff
		return ptr;
	}
	else throw(LVM_RIGISTER_SEGEMENT_ERROR);
}